

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O0

span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL>
slang::ast::Statement::createAndAddBlockItems
          (Scope *scope,StatementSyntax *syntax,bool labelHandled)

{
  bool bVar1;
  iterator ppSVar2;
  __extent_storage<18446744073709551615UL> this;
  SyntaxNode *member;
  iterator __end2_1;
  iterator __begin2_1;
  SmallVector<const_slang::syntax::SyntaxNode_*,_5UL> *__range2_1;
  StatementBlockSymbol *block;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL> *__range2;
  SmallVector<const_slang::syntax::SyntaxNode_*,_5UL> extraMembers;
  span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL> blocks;
  SyntaxNode *in_stack_00000588;
  Scope *in_stack_00000590;
  Symbol *in_stack_ffffffffffffff28;
  Scope *this_00;
  iterator local_a8;
  __normal_iterator<const_slang::ast::StatementBlockSymbol_*const_*,_std::span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL>_>
  local_88;
  span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL> *local_80;
  SmallVector<const_slang::syntax::SyntaxNode_*,_5UL> *in_stack_ffffffffffffffa8;
  char in_stack_ffffffffffffffb7;
  StatementSyntax *in_stack_ffffffffffffffb8;
  Scope *in_stack_ffffffffffffffc0;
  span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL> local_10;
  
  this_00 = (Scope *)&stack0xffffffffffffff98;
  SmallVector<const_slang::syntax::SyntaxNode_*,_5UL>::SmallVector
            ((SmallVector<const_slang::syntax::SyntaxNode_*,_5UL> *)0x6e0ef1);
  local_10 = createBlockItems(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                              (bool)in_stack_ffffffffffffffb7,in_stack_ffffffffffffffa8);
  this = local_10._M_extent._M_extent_value;
  local_80 = &local_10;
  local_88._M_current =
       (StatementBlockSymbol **)
       std::span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL>::begin
                 ((span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL> *)
                  in_stack_ffffffffffffff28);
  std::span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL>::end
            ((span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL> *)
             this._M_extent_value);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::StatementBlockSymbol_*const_*,_std::span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::StatementBlockSymbol_*const_*,_std::span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL>_>
                        *)this_00,
                       (__normal_iterator<const_slang::ast::StatementBlockSymbol_*const_*,_std::span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffff28);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<const_slang::ast::StatementBlockSymbol_*const_*,_std::span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL>_>
    ::operator*(&local_88);
    Scope::addMember(this_00,in_stack_ffffffffffffff28);
    __gnu_cxx::
    __normal_iterator<const_slang::ast::StatementBlockSymbol_*const_*,_std::span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL>_>
    ::operator++(&local_88);
  }
  local_a8 = SmallVectorBase<const_slang::syntax::SyntaxNode_*>::begin
                       ((SmallVectorBase<const_slang::syntax::SyntaxNode_*> *)
                        &stack0xffffffffffffff98);
  ppSVar2 = SmallVectorBase<const_slang::syntax::SyntaxNode_*>::end
                      ((SmallVectorBase<const_slang::syntax::SyntaxNode_*> *)
                       &stack0xffffffffffffff98);
  for (; local_a8 != ppSVar2; local_a8 = local_a8 + 1) {
    Scope::addMembers(in_stack_00000590,in_stack_00000588);
  }
  SmallVector<const_slang::syntax::SyntaxNode_*,_5UL>::~SmallVector
            ((SmallVector<const_slang::syntax::SyntaxNode_*,_5UL> *)0x6e1040);
  return local_10;
}

Assistant:

std::span<const StatementBlockSymbol* const> Statement::createAndAddBlockItems(
    Scope& scope, const StatementSyntax& syntax, bool labelHandled) {

    SmallVector<const SyntaxNode*> extraMembers;
    auto blocks = createBlockItems(scope, syntax, labelHandled, extraMembers);
    for (auto block : blocks)
        scope.addMember(*block);
    for (auto member : extraMembers)
        scope.addMembers(*member);

    return blocks;
}